

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_glib.cpp
# Opt level: O0

void __thiscall
QEventDispatcherGlibPrivate::QEventDispatcherGlibPrivate
          (QEventDispatcherGlibPrivate *this,GMainContext *context)

{
  long lVar1;
  long lVar2;
  QCoreApplication *pQVar3;
  QThread *pQVar4;
  QThread *pQVar5;
  undefined8 uVar6;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  GSource *source;
  QCoreApplication *app;
  ProcessEventsFlag in_stack_ffffffffffffff6c;
  QTimerInfoList *in_stack_ffffffffffffff70;
  QAbstractEventDispatcherPrivate *in_stack_ffffffffffffff80;
  undefined4 local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractEventDispatcherPrivate::QAbstractEventDispatcherPrivate(in_stack_ffffffffffffff80);
  *in_RDI = &PTR__QEventDispatcherGlibPrivate_00beedf0;
  in_RDI[0x13] = in_RSI;
  *(undefined1 *)(in_RDI + 0x18) = 1;
  if (in_RDI[0x13] == 0) {
    pQVar3 = QCoreApplication::instance();
    if (pQVar3 != (QCoreApplication *)0x0) {
      pQVar4 = QThread::currentThread();
      pQVar5 = QObject::thread((QObject *)0x8cef5c);
      if (pQVar4 == pQVar5) {
        uVar6 = g_main_context_default();
        in_RDI[0x13] = uVar6;
        g_main_context_ref(in_RDI[0x13]);
        goto LAB_008cefbe;
      }
    }
    uVar6 = g_main_context_new();
    in_RDI[0x13] = uVar6;
  }
  else {
    g_main_context_ref(in_RDI[0x13]);
  }
LAB_008cefbe:
  g_main_context_push_thread_default(in_RDI[0x13]);
  uVar6 = g_source_new(&postEventSourceFuncs,0x70);
  g_source_set_name(uVar6,"[Qt] GPostEventSource");
  in_RDI[0x14] = uVar6;
  QBasicAtomicInteger<int>::storeRelaxed
            ((QBasicAtomicInteger<int> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  *(undefined8 **)(in_RDI[0x14] + 0x68) = in_RDI;
  g_source_set_can_recurse(in_RDI[0x14],1);
  g_source_attach(in_RDI[0x14],in_RDI[0x13]);
  uVar6 = g_source_new(&socketNotifierSourceFuncs,0x80);
  g_source_set_name(uVar6,"[Qt] GSocketNotifierSource");
  in_RDI[0x15] = uVar6;
  lVar2 = in_RDI[0x15];
  *(undefined8 *)(lVar2 + 0x60) = 0;
  *(undefined8 *)(lVar2 + 0x68) = 0;
  *(undefined8 *)(lVar2 + 0x70) = 0;
  QList<GPollFDWithQSocketNotifier_*>::QList((QList<GPollFDWithQSocketNotifier_*> *)0x8cf0d4);
  g_source_set_can_recurse(in_RDI[0x15],1);
  g_source_attach(in_RDI[0x15],in_RDI[0x13]);
  uVar6 = g_source_new(&timerSourceFuncs,0x90);
  g_source_set_name(uVar6,"[Qt] GTimerSource");
  in_RDI[0x16] = uVar6;
  QTimerInfoList::QTimerInfoList(in_stack_ffffffffffffff70);
  QFlags<QEventLoop::ProcessEventsFlag>::QFlags
            ((QFlags<QEventLoop::ProcessEventsFlag> *)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff6c);
  *(undefined4 *)(in_RDI[0x16] + 0x88) = local_c;
  *(undefined1 *)(in_RDI[0x16] + 0x8c) = 0;
  g_source_set_can_recurse(in_RDI[0x16],1);
  g_source_attach(in_RDI[0x16],in_RDI[0x13]);
  uVar6 = g_source_new(&idleTimerSourceFuncs,0x68);
  g_source_set_name(uVar6,"[Qt] GIdleTimerSource");
  in_RDI[0x17] = uVar6;
  *(undefined8 *)(in_RDI[0x17] + 0x60) = in_RDI[0x16];
  g_source_set_can_recurse(in_RDI[0x17],1);
  g_source_attach(in_RDI[0x17],in_RDI[0x13]);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QEventDispatcherGlibPrivate::QEventDispatcherGlibPrivate(GMainContext *context)
    : mainContext(context)
{
#if GLIB_MAJOR_VERSION == 2 && GLIB_MINOR_VERSION < 32
    if (qEnvironmentVariableIsEmpty("QT_NO_THREADED_GLIB")) {
        Q_CONSTINIT static QBasicMutex mutex;
        QMutexLocker locker(&mutex);
        if (!g_thread_supported())
            g_thread_init(NULL);
    }
#endif

    if (mainContext) {
        g_main_context_ref(mainContext);
    } else {
        QCoreApplication *app = QCoreApplication::instance();
        if (app && QThread::currentThread() == app->thread()) {
            mainContext = g_main_context_default();
            g_main_context_ref(mainContext);
        } else {
            mainContext = g_main_context_new();
        }
    }

#if GLIB_CHECK_VERSION (2, 22, 0)
    g_main_context_push_thread_default (mainContext);
#endif

    // setup post event source
    GSource *source = g_source_new(&postEventSourceFuncs, sizeof(GPostEventSource));
    g_source_set_name(source, "[Qt] GPostEventSource");
    postEventSource = reinterpret_cast<GPostEventSource *>(source);

    postEventSource->serialNumber.storeRelaxed(1);
    postEventSource->d = this;
    g_source_set_can_recurse(&postEventSource->source, true);
    g_source_attach(&postEventSource->source, mainContext);

    // setup socketNotifierSource
    source = g_source_new(&socketNotifierSourceFuncs, sizeof(GSocketNotifierSource));
    g_source_set_name(source, "[Qt] GSocketNotifierSource");
    socketNotifierSource = reinterpret_cast<GSocketNotifierSource *>(source);
    (void) new (&socketNotifierSource->pollfds) QList<GPollFDWithQSocketNotifier *>();
    g_source_set_can_recurse(&socketNotifierSource->source, true);
    g_source_attach(&socketNotifierSource->source, mainContext);

    // setup normal and idle timer sources
    source = g_source_new(&timerSourceFuncs, sizeof(GTimerSource));
    g_source_set_name(source, "[Qt] GTimerSource");
    timerSource = reinterpret_cast<GTimerSource *>(source);
    (void) new (&timerSource->timerList) QTimerInfoList();
    timerSource->processEventsFlags = QEventLoop::AllEvents;
    timerSource->runWithIdlePriority = false;
    g_source_set_can_recurse(&timerSource->source, true);
    g_source_attach(&timerSource->source, mainContext);

    source = g_source_new(&idleTimerSourceFuncs, sizeof(GIdleTimerSource));
    g_source_set_name(source, "[Qt] GIdleTimerSource");
    idleTimerSource = reinterpret_cast<GIdleTimerSource *>(source);
    idleTimerSource->timerSource = timerSource;
    g_source_set_can_recurse(&idleTimerSource->source, true);
    g_source_attach(&idleTimerSource->source, mainContext);
}